

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

void writeMapBank(SortedSections *sectList,SectionType type,uint32_t bank)

{
  ushort uVar1;
  SortedSection **ppSVar2;
  char *pcVar3;
  uint16_t slack;
  ulong uStack_58;
  uint16_t bankEndAddr;
  size_t i;
  Section *pSStack_48;
  uint16_t org;
  Section *sect;
  SortedSection **pickedSection;
  SortedSection *pSStack_30;
  uint16_t prevEndAddr;
  SortedSection *zeroLenSection;
  SortedSection *section;
  uint32_t local_18;
  SectionType SStack_14;
  uint16_t used;
  uint32_t bank_local;
  SectionType type_local;
  SortedSections *sectList_local;
  
  local_18 = bank;
  SStack_14 = type;
  _bank_local = sectList;
  fprintf((FILE *)mapFile,"\n%s bank #%u:\n",sectionTypeInfo[type].name,
          (ulong)(bank + sectionTypeInfo[type].firstBank));
  section._6_2_ = 0;
  zeroLenSection = _bank_local->sections;
  pSStack_30 = _bank_local->zeroLenSections;
  pickedSection._6_2_ = sectionTypeInfo[SStack_14].startAddr;
  while( true ) {
    if (zeroLenSection == (SortedSection *)0x0 && pSStack_30 == (SortedSection *)0x0) {
      if (section._6_2_ == 0) {
        fputs("\tEMPTY\n",(FILE *)mapFile);
      }
      else {
        writeEmptySpace(pickedSection._6_2_,
                        sectionTypeInfo[SStack_14].startAddr + sectionTypeInfo[SStack_14].size);
        uVar1 = sectionTypeInfo[SStack_14].size - section._6_2_;
        pcVar3 = "s";
        if (uVar1 == 1) {
          pcVar3 = "";
        }
        fprintf((FILE *)mapFile,"\tTOTAL EMPTY: $%04x byte%s\n",(ulong)uVar1,pcVar3);
      }
      return;
    }
    ppSVar2 = nextSection(&zeroLenSection,&stack0xffffffffffffffd0);
    pSStack_48 = (*ppSVar2)->section;
    section._6_2_ = section._6_2_ + pSStack_48->size;
    if (pSStack_48->offset != 0) break;
    writeEmptySpace(pickedSection._6_2_,pSStack_48->org);
    pickedSection._6_2_ = pSStack_48->org + pSStack_48->size;
    if (pSStack_48->size == 0) {
      fprintf((FILE *)mapFile,"\tSECTION: $%04x (0 bytes) [\"%s\"]\n",(ulong)pSStack_48->org,
              pSStack_48->name);
    }
    else {
      pcVar3 = "s";
      if (pSStack_48->size == 1) {
        pcVar3 = "";
      }
      fprintf((FILE *)mapFile,"\tSECTION: $%04x-$%04x ($%04x byte%s) [\"%s\"]\n",
              (ulong)pSStack_48->org,(ulong)(pickedSection._6_2_ - 1),(ulong)pSStack_48->size,pcVar3
              ,pSStack_48->name);
    }
    if ((noSymInMap & 1U) == 0) {
      uVar1 = pSStack_48->org;
      for (; pSStack_48 != (Section *)0x0; pSStack_48 = pSStack_48->nextu) {
        for (uStack_58 = 0; uStack_58 < pSStack_48->nbSymbols; uStack_58 = uStack_58 + 1) {
          fprintf((FILE *)mapFile,"\t         $%04x = %s\n",
                  (ulong)((pSStack_48->symbols[uStack_58]->field_6).offset + (uint)uVar1),
                  pSStack_48->symbols[uStack_58]->name);
        }
        if (pSStack_48->nextu != (Section *)0x0) {
          if (pSStack_48->nextu->modifier == SECTION_UNION) {
            fprintf((FILE *)mapFile,"\t         ; Next union\n");
          }
          else if (pSStack_48->nextu->modifier == SECTION_FRAGMENT) {
            fprintf((FILE *)mapFile,"\t         ; Next fragment\n");
          }
        }
      }
    }
    *ppSVar2 = (*ppSVar2)->next;
  }
  __assert_fail("sect->offset == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/link/output.cpp"
                ,0x1bf,"writeMapBank");
}

Assistant:

static void writeMapBank(struct SortedSections const *sectList, enum SectionType type,
			 uint32_t bank)
{
	fprintf(mapFile, "\n%s bank #%" PRIu32 ":\n", sectionTypeInfo[type].name,
		bank + sectionTypeInfo[type].firstBank);

	uint16_t used = 0;
	struct SortedSection const *section = sectList->sections;
	struct SortedSection const *zeroLenSection = sectList->zeroLenSections;
	uint16_t prevEndAddr = sectionTypeInfo[type].startAddr;

	while (section || zeroLenSection) {
		struct SortedSection const **pickedSection =
			nextSection(&section, &zeroLenSection);
		struct Section const *sect = (*pickedSection)->section;

		used += sect->size;
		assert(sect->offset == 0);

		writeEmptySpace(prevEndAddr, sect->org);

		prevEndAddr = sect->org + sect->size;

		if (sect->size != 0)
			fprintf(mapFile, "\tSECTION: $%04" PRIx16 "-$%04x ($%04" PRIx16
				" byte%s) [\"%s\"]\n",
				sect->org, prevEndAddr - 1,
				sect->size, sect->size == 1 ? "" : "s",
				sect->name);
		else
			fprintf(mapFile, "\tSECTION: $%04" PRIx16 " (0 bytes) [\"%s\"]\n",
				sect->org, sect->name);

		if (!noSymInMap) {
			uint16_t org = sect->org;

			while (sect) {
				for (size_t i = 0; i < sect->nbSymbols; i++)
					// Space matches "\tSECTION: $xxxx ..."
					fprintf(mapFile, "\t         $%04" PRIx32 " = %s\n",
						sect->symbols[i]->offset + org,
						sect->symbols[i]->name);

				if (sect->nextu) {
					// Announce the following "piece"
					if (sect->nextu->modifier == SECTION_UNION)
						fprintf(mapFile,
							"\t         ; Next union\n");
					else if (sect->nextu->modifier == SECTION_FRAGMENT)
						fprintf(mapFile,
							"\t         ; Next fragment\n");
				}

				sect = sect->nextu; // Also print symbols in the following "pieces"
			}
		}

		*pickedSection = (*pickedSection)->next;
	}

	if (used == 0) {
		fputs("\tEMPTY\n", mapFile);
	} else {
		uint16_t bankEndAddr = sectionTypeInfo[type].startAddr + sectionTypeInfo[type].size;

		writeEmptySpace(prevEndAddr, bankEndAddr);

		uint16_t slack = sectionTypeInfo[type].size - used;

		fprintf(mapFile, "\tTOTAL EMPTY: $%04" PRIx16 " byte%s\n", slack,
			slack == 1 ? "" : "s");
	}
}